

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr_extensions.cpp
# Opt level: O1

void test_trackable_base(void)

{
  trackable_ptr_base *ptr_2;
  ulong uVar1;
  pointer pIVar2;
  trackable_ptr_base *ptVar3;
  trackable_base tVar4;
  trackable_ptr_base *ptr_1;
  ulong uVar5;
  pointer pIVar6;
  trackable_ptr_base *ptr;
  int iVar7;
  _Vector_base<I,_std::allocator<I>_> *this;
  long lVar8;
  pointer pIVar9;
  pointer other;
  pointer pIVar10;
  trackable_ptr<I> p;
  vector<I,_std::allocator<I>_> local_88;
  trackable_ptr_base local_68;
  char *local_50;
  pointer local_48;
  I local_40;
  
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start =
       std::_Vector_base<I,_std::allocator<I>_>::_M_allocate
                 ((_Vector_base<I,_std::allocator<I>_> *)0x1,0x7ffffffffffffff0);
  ((local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start)->
  super_trackable_base).first_ptr = (trackable_ptr_base *)0x0;
  (local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start)->i =
       1;
  pIVar9 = local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
           _M_start + 1;
  pIVar6 = local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
           _M_start + 1;
  if (local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    local_68.prev = (trackable_ptr_base *)0x0;
    local_68.next =
         ((local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
          _M_start)->super_trackable_base).first_ptr;
    ptVar3 = ((local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
              _M_start)->super_trackable_base).first_ptr;
    if (ptVar3 != (trackable_ptr_base *)0x0) {
      ptVar3->prev = &local_68;
    }
    ((local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start)->
    super_trackable_base).first_ptr = &local_68;
  }
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_finish =
       pIVar9;
  local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pIVar6;
  local_68.obj = &(local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.
                   super__Vector_impl_data._M_start)->super_trackable_base;
  if (local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start ==
      (pointer)0x0) {
LAB_001019a8:
    __assert_fail("*this",
                  "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/include/tower120/trackable_ptr.h"
                  ,0xf0,"T *tower120::trackable_ptr<I>::operator->() const [T = I]");
  }
  local_50 = "p->i == 1";
  if ((local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start)
      ->i == 1) {
    iVar7 = 2;
    pIVar10 = local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      if (pIVar9 == pIVar6) {
        lVar8 = (long)pIVar9 - (long)pIVar10;
        local_48 = pIVar6;
        if (lVar8 == 0x7ffffffffffffff0) {
          local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
          _M_start = pIVar10;
          local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
          _M_finish = pIVar9;
          local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = pIVar6;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_001019a8;
        }
        uVar1 = lVar8 >> 4;
        uVar5 = uVar1;
        if (pIVar9 == pIVar10) {
          uVar5 = 1;
        }
        this = (_Vector_base<I,_std::allocator<I>_> *)(uVar5 + uVar1);
        if ((_Vector_base<I,_std::allocator<I>_> *)0x7fffffffffffffe < this) {
          this = (_Vector_base<I,_std::allocator<I>_> *)0x7ffffffffffffff;
        }
        if (CARRY8(uVar5,uVar1)) {
          this = (_Vector_base<I,_std::allocator<I>_> *)0x7ffffffffffffff;
        }
        pIVar2 = std::_Vector_base<I,_std::allocator<I>_>::_M_allocate(this,0x7ffffffffffffff0);
        *(undefined8 *)((long)pIVar2 + lVar8) = 0;
        *(int *)((long)pIVar2 + lVar8 + 8) = iVar7;
        other = pIVar2;
        for (pIVar6 = pIVar10; pIVar9 != pIVar6; pIVar6 = pIVar6 + 1) {
          (other->super_trackable_base).first_ptr = (trackable_ptr_base *)0x0;
          ptVar3 = (pIVar6->super_trackable_base).first_ptr;
          (other->super_trackable_base).first_ptr = ptVar3;
          (pIVar6->super_trackable_base).first_ptr = (trackable_ptr_base *)0x0;
          for (; ptVar3 != (trackable_ptr_base *)0x0; ptVar3 = ptVar3->next) {
            ptVar3->obj = &other->super_trackable_base;
          }
          other->i = pIVar6->i;
          other = other + 1;
        }
        if (pIVar10 != (pointer)0x0) {
          operator_delete(pIVar10,(long)local_48 - (long)pIVar10);
        }
        pIVar6 = pIVar2 + (long)this;
      }
      else {
        (pIVar9->super_trackable_base).first_ptr = (trackable_ptr_base *)0x0;
        pIVar9->i = iVar7;
        other = pIVar9;
        pIVar2 = pIVar10;
      }
      pIVar9 = other + 1;
      iVar7 = iVar7 + 1;
      pIVar10 = pIVar2;
    } while (iVar7 != 1000);
    local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_start =
         pIVar2;
    local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data._M_finish =
         pIVar9;
    local_88.super__Vector_base<I,_std::allocator<I>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pIVar6;
    if ((pointer)local_68.obj == (pointer)0x0) goto LAB_001019a8;
    if (*(int *)((long)local_68.obj + 8) == 1) {
      if ((pointer)local_68.obj == pIVar2) {
        if (((pointer)local_68.obj != (pointer)0x0) &&
           (((local_68.obj < pIVar2 || (pIVar2 == pIVar9)) ||
            (pIVar9 = (pointer)local_68.obj, other < local_68.obj)))) goto LAB_00101a0c;
        local_40.super_trackable_base.first_ptr = (pIVar9->super_trackable_base).first_ptr;
        (pIVar9->super_trackable_base).first_ptr = (trackable_ptr_base *)0x0;
        if (local_40.super_trackable_base.first_ptr != (trackable_ptr_base *)0x0) {
          ptVar3 = local_40.super_trackable_base.first_ptr;
          do {
            ptVar3->obj = &local_40.super_trackable_base;
            ptVar3 = ptVar3->next;
          } while (ptVar3 != (trackable_ptr_base *)0x0);
        }
        local_40.i = pIVar9->i;
        tower120::trackable_base::operator=
                  (&pIVar9->super_trackable_base,&other->super_trackable_base);
        tVar4.first_ptr = local_40.super_trackable_base.first_ptr;
        pIVar9->i = other->i;
        if (&local_40 != other) {
          for (ptVar3 = (other->super_trackable_base).first_ptr; ptVar3 != (trackable_ptr_base *)0x0
              ; ptVar3 = ptVar3->next) {
            ptVar3->obj = (trackable_base *)0x0;
          }
          (other->super_trackable_base).first_ptr = local_40.super_trackable_base.first_ptr;
          local_40.super_trackable_base.first_ptr = (trackable_ptr_base *)0x0;
          for (; tVar4.first_ptr != (trackable_ptr_base *)0x0;
              tVar4.first_ptr = (tVar4.first_ptr)->next) {
            (tVar4.first_ptr)->obj = &other->super_trackable_base;
          }
        }
        other->i = local_40.i;
        for (tVar4.first_ptr = local_40.super_trackable_base.first_ptr;
            tVar4.first_ptr != (trackable_ptr_base *)0x0; tVar4.first_ptr = (tVar4.first_ptr)->next)
        {
          (tVar4.first_ptr)->obj = (trackable_base *)0x0;
        }
        if ((pointer)local_68.obj == other) {
          if ((pointer)local_68.obj == (pointer)0x0) goto LAB_001019a8;
          if (*(int *)((long)local_68.obj + 8) == 1) {
            tower120::detail::trackable_ptr_base::~trackable_ptr_base(&local_68);
            std::vector<I,_std::allocator<I>_>::~vector(&local_88);
            return;
          }
          iVar7 = 0x31;
        }
        else {
          iVar7 = 0x30;
          local_50 = "p.get() == &vec.back()";
        }
      }
      else {
        iVar7 = 0x2e;
        local_50 = "p.get() == &vec.front()";
      }
    }
    else {
      iVar7 = 0x2c;
    }
  }
  else {
    iVar7 = 0x27;
  }
  detail::require_failed
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/test/trackable_ptr_extensions.cpp"
             ,iVar7);
LAB_00101a0c:
  __assert_fail("in_container(container, ptr)",
                "/workspace/llm4binary/github/license_c_cmakelists/tower120[P]trackable_ptr/include/tower120/trackable_ptr_extensions.h"
                ,0x14,
                "std::size_t tower120::get_index(const Container &, const trackable_ptr<T> &) [T = I, Container = std::vector<I>]"
               );
}

Assistant:

void test_trackable_base(){
    struct I : trackable_base {
        int i;
        I(int i) : i(i) {}
    };

    std::vector<I> vec;
    vec.emplace_back(1);
    trackable_ptr<I> p{&vec.front()};
    REQUIRE(p->i == 1);

    for(int i=2;i<1000;++i){
        vec.emplace_back(i);
    }
    REQUIRE(p->i == 1);

    REQUIRE(p.get() == &vec.front());
    std::iter_swap(get_iterator(vec, p), std::prev(vec.end()));
    REQUIRE(p.get() == &vec.back());
    REQUIRE(p->i == 1);
}